

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O2

int dwarf_formaddr(Dwarf_Attribute attr,Dwarf_Addr *return_addr,Dwarf_Error *error)

{
  ushort attr_form;
  Dwarf_CU_Context_conflict pDVar1;
  int iVar2;
  Dwarf_Bool DVar3;
  int iVar4;
  Dwarf_Byte_Ptr pDVar5;
  char *in_R8;
  char *in_R9;
  uint form;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Debug dbg;
  Dwarf_Addr _ltmp;
  
  dbg = (Dwarf_Debug)0x0;
  cu_context = (Dwarf_CU_Context_conflict)0x0;
  iVar2 = get_attr_dbg(&dbg,&cu_context,attr,error);
  iVar4 = 1;
  if (iVar2 == 0) {
    attr_form = attr->ar_attribute_form;
    form = (uint)attr_form;
    DVar3 = dwarf_addr_form_is_indexed(form);
    pDVar1 = cu_context;
    if (DVar3 != 0) {
      iVar4 = _dwarf_look_in_local_and_tied
                        (attr_form,cu_context,attr->ar_debug_ptr,return_addr,error);
      return iVar4;
    }
    if ((attr_form == 1) || ((form == 0x10 && (cu_context->cc_producer == '\x01')))) {
      pDVar5 = _dwarf_calculate_info_section_end_ptr(cu_context);
      _ltmp = 0;
      if (pDVar5 < attr->ar_debug_ptr + pDVar1->cc_address_size) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
      }
      else {
        (*dbg->de_copy_word)(&_ltmp,attr->ar_debug_ptr,(ulong)pDVar1->cc_address_size);
        *return_addr = _ltmp;
        iVar4 = 0;
      }
    }
    else {
      generate_form_error(dbg,error,form,0x1f7a6e,in_R8,in_R9);
    }
  }
  return iVar4;
}

Assistant:

int
dwarf_formaddr(Dwarf_Attribute attr,
    Dwarf_Addr * return_addr, Dwarf_Error * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Addr ret_addr = 0;
    Dwarf_CU_Context cu_context = 0;
    Dwarf_Half attrform = 0;
    int res = 0;

    res  = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    attrform = attr->ar_attribute_form;
    if (dwarf_addr_form_is_indexed(attrform)) {
        res = _dwarf_look_in_local_and_tied(
            attrform,
            cu_context,
            attr->ar_debug_ptr,
            return_addr,
            error);
        return res;
    }
    if (attrform == DW_FORM_addr ||
        (cu_context->cc_producer == CC_PROD_METROWERKS &&
        attrform == DW_FORM_ref_addr)
            /* Allowance of
            DW_FORM_ref_addr was a mistake. The value returned in that
            case is NOT an address it is a global debug_info
            offset (ie, not CU-relative offset within the CU
            in debug_info).
            A Metrowerks old C generates ref_adder!
            The DWARF2 document refers to it as an address
            (misleadingly) in sec 6.5.4 where it describes
            the reference form. It is
            address-sized so that the linker can easily update it, but
            it is a reference inside the debug_info section. No longer
            allowed except for Metrowerks C. */
        ) {
        Dwarf_Small *section_end =
            _dwarf_calculate_info_section_end_ptr(cu_context);

        READ_UNALIGNED_CK(dbg, ret_addr, Dwarf_Addr,
            attr->ar_debug_ptr,
            cu_context->cc_address_size,
            error,section_end);
        *return_addr = ret_addr;
        return DW_DLV_OK;
    }
    generate_form_error(dbg,error,attrform,
        DW_DLE_ATTR_FORM_BAD,
        "DW_DLE_ATTR_FORM_BAD",
        "dwarf_formaddr");
    return DW_DLV_ERROR;
}